

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

container_t *
container_lazy_xor(container_t *c1,uint8_t type1,container_t *c2,uint8_t type2,uint8_t *result_type)

{
  _Bool _Var1;
  int iVar2;
  array_container_t *src_1;
  array_container_t *src_2;
  array_container_t *paVar3;
  container_t *result;
  run_container_t *local_38;
  byte local_2a;
  byte local_29;
  
  local_2a = type2;
  local_29 = type1;
  src_1 = (array_container_t *)container_unwrap_shared(c1,&local_29);
  src_2 = (array_container_t *)container_unwrap_shared(c2,&local_2a);
  local_38 = (run_container_t *)0x0;
  switch((uint)local_2a + (uint)local_29 * 4) {
  case 5:
    local_38 = (run_container_t *)bitset_container_create();
    bitset_container_xor_nocard
              ((bitset_container_t *)src_1,(bitset_container_t *)src_2,
               (bitset_container_t *)local_38);
    goto LAB_00109deb;
  case 6:
    local_38 = (run_container_t *)bitset_container_create();
    *result_type = '\x01';
    paVar3 = src_1;
    goto LAB_00109dca;
  case 7:
    local_38 = (run_container_t *)bitset_container_create();
    paVar3 = src_1;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x1690,
                  "container_t *container_lazy_xor(const container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                 );
  case 9:
    local_38 = (run_container_t *)bitset_container_create();
    *result_type = '\x01';
    paVar3 = src_2;
    src_2 = src_1;
LAB_00109dca:
    array_bitset_container_lazy_xor
              (src_2,(bitset_container_t *)paVar3,(bitset_container_t *)local_38);
    return local_38;
  case 10:
    _Var1 = array_array_container_lazy_xor(src_1,src_2,&local_38);
    *result_type = '\x02' - _Var1;
    return local_38;
  case 0xb:
    local_38 = run_container_create();
    paVar3 = src_2;
    goto LAB_00109d97;
  case 0xd:
    local_38 = (run_container_t *)bitset_container_create();
    paVar3 = src_2;
    src_2 = src_1;
    break;
  case 0xe:
    local_38 = run_container_create();
    paVar3 = src_1;
    src_1 = src_2;
LAB_00109d97:
    array_run_container_lazy_xor(src_1,(run_container_t *)paVar3,local_38);
    *result_type = '\x03';
    return local_38;
  case 0xf:
    iVar2 = run_run_container_xor((run_container_t *)src_1,(run_container_t *)src_2,&local_38);
    *result_type = (uint8_t)iVar2;
    return local_38;
  }
  run_bitset_container_lazy_xor
            ((run_container_t *)src_2,(bitset_container_t *)paVar3,(bitset_container_t *)local_38);
LAB_00109deb:
  *result_type = '\x01';
  return local_38;
}

Assistant:

static inline container_t *container_lazy_xor(
    const container_t *c1, uint8_t type1,
    const container_t *c2, uint8_t type2,
    uint8_t *result_type
){
    c1 = container_unwrap_shared(c1, &type1);
    c2 = container_unwrap_shared(c2, &type2);
    container_t *result = NULL;
    switch (PAIR_CONTAINER_TYPES(type1, type2)) {
        case CONTAINER_PAIR(BITSET,BITSET):
            result = bitset_container_create();
            bitset_container_xor_nocard(
                const_CAST_bitset(c1), const_CAST_bitset(c2),
                CAST_bitset(result));  // is lazy
            *result_type = BITSET_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,ARRAY):
            *result_type = array_array_container_lazy_xor(
                                const_CAST_array(c1),
                                const_CAST_array(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(RUN,RUN):
            // nothing special done yet.
            *result_type =
                run_run_container_xor(const_CAST_run(c1),
                                      const_CAST_run(c2), &result);
            return result;

        case CONTAINER_PAIR(BITSET,ARRAY):
            result = bitset_container_create();
            *result_type = BITSET_CONTAINER_TYPE;
            array_bitset_container_lazy_xor(const_CAST_array(c2),
                                            const_CAST_bitset(c1),
                                            CAST_bitset(result));
            return result;

        case CONTAINER_PAIR(ARRAY,BITSET):
            result = bitset_container_create();
            *result_type = BITSET_CONTAINER_TYPE;
            array_bitset_container_lazy_xor(const_CAST_array(c1),
                                            const_CAST_bitset(c2),
                                            CAST_bitset(result));
            return result;

        case CONTAINER_PAIR(BITSET,RUN):
            result = bitset_container_create();
            run_bitset_container_lazy_xor(const_CAST_run(c2),
                                          const_CAST_bitset(c1),
                                          CAST_bitset(result));
            *result_type = BITSET_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(RUN,BITSET):
            result = bitset_container_create();
            run_bitset_container_lazy_xor(const_CAST_run(c1),
                                          const_CAST_bitset(c2),
                                          CAST_bitset(result));
            *result_type = BITSET_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,RUN):
            result = run_container_create();
            array_run_container_lazy_xor(const_CAST_array(c1),
                                         const_CAST_run(c2),
                                         CAST_run(result));
            *result_type = RUN_CONTAINER_TYPE;
            // next line skipped since we are lazy
            // result = convert_run_to_efficient_container(result, result_type);
            return result;

        case CONTAINER_PAIR(RUN,ARRAY):
            result = run_container_create();
            array_run_container_lazy_xor(const_CAST_array(c2),
                                         const_CAST_run(c1),
                                         CAST_run(result));
            *result_type = RUN_CONTAINER_TYPE;
            // next line skipped since we are lazy
            // result = convert_run_to_efficient_container(result, result_type);
            return result;

        default:
            assert(false);
            __builtin_unreachable();
            return NULL;  // unreached
    }
}